

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::ObjectIntersector1<false>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined4 uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  RTCIntersectFunctionN p_Var7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong unaff_R12;
  size_t mask;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  vint4 bi;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vint4 ai;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar29;
  float fVar30;
  undefined1 auVar27 [16];
  float fVar31;
  undefined1 auVar28 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  int mask_1;
  ulong local_8f0;
  ulong local_8e8;
  ulong local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  NodeRef *local_8c0;
  RayQueryContext *local_8b8;
  Scene *local_8b0;
  ulong local_8a8;
  RTCIntersectFunctionNArguments local_8a0;
  Geometry *local_870;
  undefined8 local_868;
  RTCIntersectArguments *local_860;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_8c0 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar18 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx((undefined1  [16])aVar2,auVar27);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar27,auVar32,1);
      auVar27 = vblendvps_avx((undefined1  [16])aVar2,auVar32,auVar27);
      auVar32 = vrcpps_avx(auVar27);
      fVar26 = auVar32._0_4_;
      auVar22._0_4_ = fVar26 * auVar27._0_4_;
      fVar29 = auVar32._4_4_;
      auVar22._4_4_ = fVar29 * auVar27._4_4_;
      fVar30 = auVar32._8_4_;
      auVar22._8_4_ = fVar30 * auVar27._8_4_;
      fVar31 = auVar32._12_4_;
      auVar22._12_4_ = fVar31 * auVar27._12_4_;
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = &DAT_3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar33,auVar22);
      auVar23._0_4_ = fVar26 + fVar26 * auVar27._0_4_;
      auVar23._4_4_ = fVar29 + fVar29 * auVar27._4_4_;
      auVar23._8_4_ = fVar30 + fVar30 * auVar27._8_4_;
      auVar23._12_4_ = fVar31 + fVar31 * auVar27._12_4_;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_7e8._4_4_ = uVar3;
      local_7e8._0_4_ = uVar3;
      local_7e8._8_4_ = uVar3;
      local_7e8._12_4_ = uVar3;
      auVar36 = ZEXT1664(local_7e8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_7f8._4_4_ = uVar3;
      local_7f8._0_4_ = uVar3;
      local_7f8._8_4_ = uVar3;
      local_7f8._12_4_ = uVar3;
      auVar37 = ZEXT1664(local_7f8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_808._4_4_ = uVar3;
      local_808._0_4_ = uVar3;
      local_808._8_4_ = uVar3;
      local_808._12_4_ = uVar3;
      auVar38 = ZEXT1664(local_808);
      local_818 = vshufps_avx(auVar23,auVar23,0);
      auVar39 = ZEXT1664(local_818);
      auVar27 = vmovshdup_avx(auVar23);
      local_828 = vshufps_avx(auVar23,auVar23,0x55);
      auVar40 = ZEXT1664(local_828);
      auVar32 = vshufpd_avx(auVar23,auVar23,1);
      uVar11 = (ulong)(auVar23._0_4_ < 0.0) << 4;
      local_838 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar28 = ZEXT1664(local_838);
      uVar12 = (ulong)(auVar27._0_4_ < 0.0) << 4 | 0x20;
      uVar13 = (ulong)(auVar32._0_4_ < 0.0) << 4 | 0x40;
      uVar14 = uVar11 ^ 0x10;
      uVar16 = uVar12 ^ 0x10;
      uVar5 = uVar13 ^ 0x10;
      local_848 = vshufps_avx(auVar18,auVar18,0);
      auVar34 = ZEXT1664(local_848);
      local_858 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      auVar35 = ZEXT1664(local_858);
      local_8f0 = uVar5;
      local_8e8 = uVar16;
      local_8e0 = uVar14;
      local_8d8 = uVar13;
      local_8d0 = uVar12;
      local_8c8 = uVar11;
      local_8b8 = context;
      do {
        if (local_8c0 == stack) {
          return;
        }
        uVar10 = local_8c0[-1].ptr;
        local_8c0 = local_8c0 + -1;
        do {
          if ((uVar10 & 8) == 0) {
            auVar27 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar11),auVar36._0_16_);
            auVar18._0_4_ = auVar39._0_4_ * auVar27._0_4_;
            auVar18._4_4_ = auVar39._4_4_ * auVar27._4_4_;
            auVar18._8_4_ = auVar39._8_4_ * auVar27._8_4_;
            auVar18._12_4_ = auVar39._12_4_ * auVar27._12_4_;
            auVar27 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar12),auVar37._0_16_);
            auVar19._0_4_ = auVar40._0_4_ * auVar27._0_4_;
            auVar19._4_4_ = auVar40._4_4_ * auVar27._4_4_;
            auVar19._8_4_ = auVar40._8_4_ * auVar27._8_4_;
            auVar19._12_4_ = auVar40._12_4_ * auVar27._12_4_;
            auVar27 = vpmaxsd_avx(auVar18,auVar19);
            auVar18 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar13),auVar38._0_16_);
            auVar20._0_4_ = auVar28._0_4_ * auVar18._0_4_;
            auVar20._4_4_ = auVar28._4_4_ * auVar18._4_4_;
            auVar20._8_4_ = auVar28._8_4_ * auVar18._8_4_;
            auVar20._12_4_ = auVar28._12_4_ * auVar18._12_4_;
            auVar18 = vpmaxsd_avx(auVar20,auVar34._0_16_);
            auVar27 = vpmaxsd_avx(auVar27,auVar18);
            auVar18 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar14),auVar36._0_16_);
            auVar21._0_4_ = auVar39._0_4_ * auVar18._0_4_;
            auVar21._4_4_ = auVar39._4_4_ * auVar18._4_4_;
            auVar21._8_4_ = auVar39._8_4_ * auVar18._8_4_;
            auVar21._12_4_ = auVar39._12_4_ * auVar18._12_4_;
            auVar18 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar16),auVar37._0_16_);
            auVar24._0_4_ = auVar40._0_4_ * auVar18._0_4_;
            auVar24._4_4_ = auVar40._4_4_ * auVar18._4_4_;
            auVar24._8_4_ = auVar40._8_4_ * auVar18._8_4_;
            auVar24._12_4_ = auVar40._12_4_ * auVar18._12_4_;
            auVar18 = vpminsd_avx(auVar21,auVar24);
            auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar5),auVar38._0_16_);
            auVar25._0_4_ = auVar28._0_4_ * auVar32._0_4_;
            auVar25._4_4_ = auVar28._4_4_ * auVar32._4_4_;
            auVar25._8_4_ = auVar28._8_4_ * auVar32._8_4_;
            auVar25._12_4_ = auVar28._12_4_ * auVar32._12_4_;
            auVar32 = vpminsd_avx(auVar25,auVar35._0_16_);
            auVar18 = vpminsd_avx(auVar18,auVar32);
            auVar27 = vpcmpgtd_avx(auVar27,auVar18);
            uVar3 = vmovmskps_avx(auVar27);
            unaff_R12 = (ulong)(byte)((byte)uVar3 ^ 0xf);
          }
          if ((uVar10 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar15 = 4;
            }
            else {
              uVar9 = uVar10 & 0xfffffffffffffff0;
              lVar6 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              iVar15 = 0;
              uVar10 = *(ulong *)(uVar9 + lVar6 * 8);
              uVar8 = unaff_R12 - 1 & unaff_R12;
              if (uVar8 != 0) {
                local_8c0->ptr = uVar10;
                lVar6 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                uVar4 = uVar8 - 1;
                while( true ) {
                  local_8c0 = local_8c0 + 1;
                  uVar10 = *(ulong *)(uVar9 + lVar6 * 8);
                  uVar4 = uVar4 & uVar8;
                  if (uVar4 == 0) break;
                  local_8c0->ptr = uVar10;
                  lVar6 = 0;
                  if (uVar4 != 0) {
                    for (; (uVar4 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                    }
                  }
                  uVar8 = uVar4 - 1;
                }
              }
            }
          }
          else {
            iVar15 = 6;
          }
        } while (iVar15 == 0);
        if (iVar15 == 6) {
          iVar15 = 0;
          local_8a8 = (ulong)((uint)uVar10 & 0xf) - 8;
          bVar17 = local_8a8 != 0;
          if (bVar17) {
            local_8b0 = local_8b8->scene;
            uVar9 = 0;
            do {
              local_8a0.geomID = *(uint *)((uVar10 & 0xfffffffffffffff0) + uVar9 * 8);
              local_870 = (local_8b0->geometries).items[local_8a0.geomID].ptr;
              if ((ray->mask & local_870->mask) != 0) {
                local_8a0.primID = *(uint *)((uVar10 & 0xfffffffffffffff0) + 4 + uVar9 * 8);
                mask_1 = -1;
                local_8a0.valid = &mask_1;
                local_8a0.geometryUserPtr = local_870->userPtr;
                local_8a0.context = local_8b8->user;
                local_8a0.N = 1;
                local_868 = 0;
                local_860 = local_8b8->args;
                p_Var7 = local_860->intersect;
                if (p_Var7 == (RTCIntersectFunctionN)0x0) {
                  p_Var7 = (RTCIntersectFunctionN)
                           local_870[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                           ._M_i;
                }
                local_8a0.rayhit = (RTCRayHitN *)ray;
                (*p_Var7)(&local_8a0);
                auVar36 = ZEXT1664(local_7e8);
                auVar37 = ZEXT1664(local_7f8);
                auVar38 = ZEXT1664(local_808);
                auVar39 = ZEXT1664(local_818);
                auVar40 = ZEXT1664(local_828);
                auVar28 = ZEXT1664(local_838);
                auVar34 = ZEXT1664(local_848);
                auVar35 = ZEXT1664(local_858);
                if (ray->tfar < 0.0) {
                  uVar5 = local_8f0;
                  uVar11 = local_8c8;
                  uVar12 = local_8d0;
                  uVar13 = local_8d8;
                  uVar14 = local_8e0;
                  uVar16 = local_8e8;
                  if (bVar17) {
                    ray->tfar = -INFINITY;
                    iVar15 = 3;
                  }
                  break;
                }
              }
              uVar9 = uVar9 + 1;
              bVar17 = uVar9 < local_8a8;
              uVar5 = local_8f0;
              uVar11 = local_8c8;
              uVar12 = local_8d0;
              uVar13 = local_8d8;
              uVar14 = local_8e0;
              uVar16 = local_8e8;
            } while (uVar9 != local_8a8);
          }
        }
      } while (iVar15 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }